

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cpp
# Opt level: O0

int __thiscall zmq::pair_t::xsend(pair_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  size_t in_RCX;
  void *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  pipe_t *in_RDI;
  char *errstr;
  int rc;
  int local_4;
  
  if ((in_RDI[5]._peers_msgs_read == 0) ||
     (ctx = in_RSI,
     uVar3 = pipe_t::write((pipe_t *)in_RDI[5]._peers_msgs_read,(int)in_RSI,in_RDX,in_RCX),
     (uVar3 & 1) == 0)) {
    piVar4 = __errno_location();
    *piVar4 = 0xb;
    local_4 = -1;
  }
  else {
    bVar1 = msg_t::flags((msg_t *)in_RSI);
    if ((bVar1 & 1) == 0) {
      pipe_t::flush(in_RDI);
    }
    iVar2 = msg_t::init((msg_t *)in_RSI,ctx);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/pair.cpp"
              ,0x65);
      fflush(_stderr);
      zmq_abort((char *)0x2fd68c);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::pair_t::xsend (msg_t *msg_)
{
    if (!_pipe || !_pipe->write (msg_)) {
        errno = EAGAIN;
        return -1;
    }

    if (!(msg_->flags () & msg_t::more))
        _pipe->flush ();

    //  Detach the original message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}